

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.hpp
# Opt level: O0

void __thiscall Sega::MasterSystem::Machine::Options::Options(Options *this,OptionsType type)

{
  bool bVar1;
  OptionsType type_local;
  Options *this_local;
  
  Reflection::StructImpl<Sega::MasterSystem::Machine::Options>::StructImpl
            (&this->super_StructImpl<Sega::MasterSystem::Machine::Options>);
  Configurable::DisplayOption<Sega::MasterSystem::Machine::Options>::DisplayOption
            (&this->super_DisplayOption<Sega::MasterSystem::Machine::Options>,
             (uint)(type != UserFriendly) * 2);
  (this->super_StructImpl<Sega::MasterSystem::Machine::Options>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca2c10;
  bVar1 = Reflection::StructImpl<Sega::MasterSystem::Machine::Options>::needs_declare
                    (&this->super_StructImpl<Sega::MasterSystem::Machine::Options>);
  if (bVar1) {
    Configurable::DisplayOption<Sega::MasterSystem::Machine::Options>::declare_display_option
              (&this->super_DisplayOption<Sega::MasterSystem::Machine::Options>);
  }
  return;
}

Assistant:

Options(Configurable::OptionsType type) :
					Configurable::DisplayOption<Options>(type == Configurable::OptionsType::UserFriendly ? Configurable::Display::RGB : Configurable::Display::CompositeColour) {
					if(needs_declare()) {
						declare_display_option();
					}
				}